

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

bool __thiscall QRhiWidget::event(QRhiWidget *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QRhiWidgetPrivate *this_00;
  QRhi *pQVar3;
  QEvent *in_RSI;
  QPoint *in_RDI;
  long in_FS_OFFSET;
  QRhiWidgetPrivate *d;
  QEvent *in_stack_000000d8;
  QWidget *in_stack_000000e0;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  QSize *in_stack_ffffffffffffffa0;
  QRhi *pQVar4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 local_20 [16];
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QRhiWidget *)0x348f2f);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Show) {
    bVar1 = QWidget::isVisible((QWidget *)0x348fe4);
    if (bVar1) {
      QPoint::QPoint((QPoint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
      QWidget::size((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      QRect::QRect((QRect *)CONCAT44(TVar2,in_stack_ffffffffffffffb0),in_RDI,
                   in_stack_ffffffffffffffa0);
      QRegion::QRegion(&local_10,(QRect *)local_20,Rectangle);
      QWidgetPrivate::sendPaintEvent
                (&this_00->super_QWidgetPrivate,
                 (QRegion *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      QRegion::~QRegion(&local_10);
    }
  }
  else if ((TVar2 == WindowAboutToChangeInternal) &&
          (this_00->textureInvalid = true, this_00->rhi != (QRhi *)0x0)) {
    pQVar4 = this_00->rhi;
    pQVar3 = QBackingStoreRhiSupport::rhi(&this_00->offscreenRenderer);
    if (pQVar4 != pQVar3) {
      QRhi::removeCleanupCallback(this_00->rhi);
      (**(code **)((long)*in_RDI + 0x1b0))();
      QRhiWidgetPrivate::releaseResources
                ((QRhiWidgetPrivate *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
      ;
    }
  }
  bVar1 = QWidget::event(in_stack_000000e0,in_stack_000000d8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QRhiWidget::event(QEvent *e)
{
    Q_D(QRhiWidget);
    switch (e->type()) {
    case QEvent::WindowAboutToChangeInternal:
        // The QRhi will almost certainly change, prevent texture() from
        // returning the existing QRhiTexture in the meantime.
        d->textureInvalid = true;

        if (d->rhi && d->rhi != d->offscreenRenderer.rhi()) {
            // Drop the cleanup callback registered to the toplevel's rhi and
            // do the early-release, there may not be another chance to do
            // this, and the QRhi we have currently set may be destroyed by the
            // time we get to ensureRhi() again.
            d->rhi->removeCleanupCallback(this);
            releaseResources(); // notify the user code about the early-release
            d->releaseResources();
            // must _not_ null out d->rhi here, for proper interaction with ensureRhi()
        }

        break;

    case QEvent::Show:
        if (isVisible())
            d->sendPaintEvent(QRect(QPoint(0, 0), size()));
        break;
    default:
        break;
    }
    return QWidget::event(e);
}